

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

Matrix<double,__1,_1,_0,__1,_1> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::setTcopy
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Matrix<double,__1,_1,_0,__1,_1> *t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  Index size;
  Index index;
  ulong uVar7;
  long lVar8;
  ActualDstType actualDst;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  
  this_00 = &this->Tcopy1;
  if (this->Tcopy == this_00) {
    this_00 = &this->Tcopy2;
    pdVar3 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar7 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if ((this->Tcopy2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar7) {
      if ((long)uVar7 < 0) goto LAB_00128289;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this_00,uVar7,uVar7,1);
    }
    uVar4 = (this->Tcopy2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (uVar4 != uVar7) goto LAB_0012826a;
    pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar7 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar4) {
      lVar8 = 0;
      do {
        pdVar1 = pdVar3 + lVar8;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar5 + lVar8;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < (long)uVar4) {
      do {
        pdVar5[uVar7] = pdVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  else {
    pdVar3 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar7 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if ((this->Tcopy1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar7) {
      if ((long)uVar7 < 0) {
LAB_00128289:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this_00,uVar7,uVar7,1);
    }
    uVar4 = (this->Tcopy1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (uVar4 != uVar7) {
LAB_0012826a:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar7 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar4) {
      lVar8 = 0;
      do {
        pdVar1 = pdVar3 + lVar8;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar5 + lVar8;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < (long)uVar4) {
      do {
        pdVar5[uVar7] = pdVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  this->copyInit = true;
  this->Tcopy = this_00;
  return this_00;
}

Assistant:

const T &Signal<T, Time>::setTcopy(const T &t) {
  if (Tcopy == &Tcopy1) {
    Tcopy2 = t;
    copyInit = true;
    Tcopy = &Tcopy2;
    return Tcopy2;
  } else {
    Tcopy1 = t;
    copyInit = true;
    Tcopy = &Tcopy1;
    return Tcopy1;
  }
}